

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

void despot::DESPOT::Update(VNode *vnode)

{
  bool bVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  QNode *this;
  ulong uVar3;
  double value;
  double dVar4;
  double dVar5;
  ValuedAction VVar6;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (!bVar1) {
    VVar6 = VNode::default_move(vnode);
    local_38 = VVar6.value;
    VVar6 = VNode::default_move(vnode);
    value = VVar6.value;
    local_48 = -INFINITY;
    pvVar2 = VNode::children(vnode);
    if ((pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      dVar4 = -INFINITY;
    }
    else {
      uVar3 = 0;
      local_40 = value;
      local_30 = local_38;
      do {
        this = VNode::Child(vnode,(ACT_TYPE)uVar3);
        local_38 = QNode::lower_bound(this);
        if (local_38 <= local_30) {
          local_38 = local_30;
        }
        value = QNode::upper_bound(this);
        if (value <= local_40) {
          value = local_40;
        }
        dVar4 = this->utility_upper_bound;
        if (this->utility_upper_bound <= local_48) {
          dVar4 = local_48;
        }
        uVar3 = uVar3 + 1;
        pvVar2 = VNode::children(vnode);
        local_48 = dVar4;
        local_40 = value;
        local_30 = local_38;
      } while (uVar3 < (ulong)((long)(pvVar2->
                                     super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    dVar5 = VNode::lower_bound(vnode);
    if (dVar5 < local_38) {
      VNode::lower_bound(vnode,local_38);
    }
    dVar5 = VNode::upper_bound(vnode);
    if (value < dVar5) {
      VNode::upper_bound(vnode,value);
    }
    if (dVar4 < vnode->utility_upper_bound) {
      vnode->utility_upper_bound = dVar4;
    }
  }
  return;
}

Assistant:

void DESPOT::Update(VNode* vnode) {
	if (vnode->IsLeaf()) {
		return;
	}

	double lower = vnode->default_move().value;
	double upper = vnode->default_move().value;
	double utility_upper = Globals::NEG_INFTY;

	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* qnode = vnode->Child(action);

		lower = max(lower, qnode->lower_bound());
		upper = max(upper, qnode->upper_bound());
		utility_upper = max(utility_upper, qnode->utility_upper_bound);
	}

	if (lower > vnode->lower_bound()) {
		vnode->lower_bound(lower);
	}
	if (upper < vnode->upper_bound()) {
		vnode->upper_bound(upper);
	}
	if (utility_upper < vnode->utility_upper_bound) {
		vnode->utility_upper_bound = utility_upper;
	}
}